

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_call.hpp
# Opt level: O0

void squall::detail::call_setup<Foo*>(HSQUIRRELVM vm,HSQOBJECT *table,string *name,Foo *args)

{
  HSQOBJECT obj;
  HSQOBJECT obj_00;
  SQRESULT SVar1;
  squirrel_error *psVar2;
  SQInteger in_stack_ffffffffffffff38;
  HSQUIRRELVM in_stack_ffffffffffffff40;
  HSQUIRRELVM in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  SQChar *in_stack_ffffffffffffff68;
  SQObjectValue in_stack_ffffffffffffff70;
  SQBool in_stack_ffffffffffffff78;
  SQInteger in_stack_ffffffffffffff80;
  HSQUIRRELVM v;
  string local_58 [32];
  undefined8 local_38;
  SQObjectValue local_30;
  Foo *local_28;
  Foo *args_local;
  string *name_local;
  HSQOBJECT *table_local;
  HSQUIRRELVM vm_local;
  
  local_38 = *(undefined8 *)table;
  local_30 = table->_unVal;
  obj._unVal.pTable = in_stack_ffffffffffffff70.pTable;
  obj._0_8_ = in_stack_ffffffffffffff68;
  local_28 = args;
  args_local = (Foo *)name;
  name_local = (string *)table;
  table_local = (HSQOBJECT *)vm;
  sq_pushobject((HSQUIRRELVM)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),obj);
  std::__cxx11::string::data();
  std::__cxx11::string::length();
  sq_pushstring((HSQUIRRELVM)in_stack_ffffffffffffff70.pTable,in_stack_ffffffffffffff68,
                CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  SVar1 = sq_get(in_stack_ffffffffffffff48,(SQInteger)in_stack_ffffffffffffff40);
  if (SVar1 < 0) {
    psVar2 = (squirrel_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "can\'t find such function: ");
    squirrel_error::squirrel_error(psVar2,local_58);
    __cxa_throw(psVar2,&squirrel_error::typeinfo,squirrel_error::~squirrel_error);
  }
  sq_remove(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  v = *(HSQUIRRELVM *)name_local;
  obj_00._unVal.pTable = in_stack_ffffffffffffff70.pTable;
  obj_00._0_8_ = in_stack_ffffffffffffff68;
  sq_pushobject((HSQUIRRELVM)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),obj_00);
  call_setup_arg<Foo*>((HSQUIRRELVM)table_local,local_28);
  SVar1 = sq_call(v,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                  in_stack_ffffffffffffff70.nInteger);
  if (SVar1 < 0) {
    psVar2 = (squirrel_error *)__cxa_allocate_exception(0x10);
    std::operator+(&stack0xffffffffffffff68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "function call failed: ");
    squirrel_error::squirrel_error(psVar2,(string *)&stack0xffffffffffffff68);
    __cxa_throw(psVar2,&squirrel_error::typeinfo,squirrel_error::~squirrel_error);
  }
  return;
}

Assistant:

inline
void call_setup(HSQUIRRELVM vm, const HSQOBJECT& table,
                const string& name, T... args) {

    sq_pushobject(vm, table);
    sq_pushstring(vm, name.data(), name.length());
    if (!SQ_SUCCEEDED(sq_get(vm, -2))) {
        throw squirrel_error(_SC("can't find such function: ") + name);
    }

    sq_remove(vm, -2);
    sq_pushobject(vm, table);
    call_setup_arg(vm, args...);
    if (!SQ_SUCCEEDED(sq_call(vm, sizeof...(args)+1, SQTrue, SQTrue))) {
        throw squirrel_error(_SC("function call failed: ") + name);
    }
}